

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.cpp
# Opt level: O0

void baoliSearch(int curlv,int remainF,int remainA,int gridSz)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  rep rVar5;
  ostream *this;
  vector<int_*,_std::allocator<int_*>_> *this_00;
  reference pvVar6;
  reference pvVar7;
  float fVar8;
  float fVar9;
  int newAS;
  float newAtk;
  __normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_> local_70;
  iterator end;
  iterator iter;
  int i;
  vector<int_*,_std::allocator<int_*>_> *tlist;
  BelongStructure *curres;
  int tAssignN [4];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  rep local_20;
  int local_18;
  int local_14;
  int gridSz_local;
  int remainA_local;
  int remainF_local;
  int curlv_local;
  
  local_18 = gridSz;
  local_14 = remainA;
  gridSz_local = remainF;
  remainA_local = curlv;
  if ((curlv == gridSz) || ((remainF == 0 && (remainA == 0)))) {
    local_30.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_28.__r = (rep)std::chrono::operator-(&local_30,&logtime);
    restime.__r = (rep)std::chrono::
                       duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                 (&local_28);
    local_20 = restime.__r;
    rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&restime);
    if (15000000 < rVar5) {
      this = std::operator<<((ostream *)&std::cout,"ERROR:TLE");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    memset(&curres,0,0x10);
    getAssignN((int *)&curres,local_18);
    this_00 = &dpRes[(int)curres][curres._4_4_][tAssignN[0]][tAssignN[1]].belongings;
    iter._M_current._4_4_ = 0;
    end = std::vector<int_*,_std::allocator<int_*>_>::begin(this_00);
    local_70._M_current = (int **)std::vector<int_*,_std::allocator<int_*>_>::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=(&end,&local_70), bVar2) {
      getCurAssign(end);
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&dpRes[(int)curres][curres._4_4_][tAssignN[0]][tAssignN[1]].as,
                          (long)iter._M_current._4_4_);
      fVar1 = op_coef;
      fVar9 = *pvVar6;
      fVar8 = calOPAtk(local_18);
      fVar9 = fVar1 * fVar8 + fVar9;
      if (resAtk < fVar9) {
        iVar3 = calAS(local_18);
        iVar4 = calASofBomber(local_18);
        if (tarAirSupremacy <= iVar3 + iVar4) {
          resBomberNum = curBomberNum - local_14;
          resAtk = fVar9;
          resAS = iVar3 + iVar4;
          copySign2Res(resSign,local_18);
          copyCurAssign2Res(resAssign,resAssignGrid);
          if ((flushFlag & 1U) != 0) {
            std::vector<Plane,_std::allocator<Plane>_>::operator=(&ResPlaneVecA,&planeVecA);
            flushFlag = false;
          }
        }
      }
      __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>::operator++
                (&end);
      iter._M_current._4_4_ = iter._M_current._4_4_ + 1;
    }
  }
  else {
    if (remainF != 0) {
      sign[curlv] = 1;
      baoliSearch(curlv + 1,remainF + -1,remainA,gridSz);
      sign[remainA_local] = 0;
    }
    if (local_14 != 0) {
      sign[remainA_local] = 2;
      bVar2 = cutF(remainA_local + 1,gridSz_local,local_18);
      if (bVar2) {
        pvVar7 = std::vector<Grid,_std::allocator<Grid>_>::operator[](&gridVec,(long)remainA_local);
        if (pvVar7->isFighterOnly == 0) {
          baoliSearch(remainA_local + 1,gridSz_local,local_14 + -1,local_18);
        }
        else {
          sign[remainA_local] = 0;
          baoliSearch(remainA_local + 1,gridSz_local,local_14,local_18);
        }
      }
      sign[remainA_local] = 0;
    }
  }
  return;
}

Assistant:

void baoliSearch(int curlv,int remainF,int remainA,int gridSz){
    if(curlv == gridSz || (remainF == 0 && remainA == 0)){//�ݹ�����
        if(restime=std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::system_clock::now()-logtime),restime.count()>TLE*1000000){
            cout<<"ERROR:TLE"<<endl;
            exit(0);
        }
        int tAssignN[4] = {0, 0, 0, 0};
        getAssignN(tAssignN, gridSz);//sav avail grids num to ships
        BelongStructure &curres=dpRes[tAssignN[0]][tAssignN[1]][tAssignN[2]][tAssignN[3]];
        vector<int *> &tlist=curres.belongings;
        int i=0;
        for(vector<int *>::iterator iter=tlist.begin(),end=tlist.end();iter!=end;++iter){
            getCurAssign(iter);
            float newAtk = curres.as[i++] + op_coef * calOPAtk(gridSz);
            if(newAtk > resAtk){
                int newAS = calAS(gridSz) + calASofBomber(gridSz);
                if(newAS >= tarAirSupremacy){
                    //write cur data to res
                    resAtk = newAtk;
                    resAS = newAS;
                    resBomberNum = curBomberNum - remainA;
                    copySign2Res(resSign, gridSz);
                    copyCurAssign2Res(resAssign,resAssignGrid);

                    if(flushFlag){
                        ResPlaneVecA = planeVecA;
                        flushFlag = 0;
                    }
                }
            }
        }
        return;
    }
    if(remainF){//���Է���ս���������ⷣվ
        sign[curlv]=1;
        baoliSearch(curlv+1,remainF-1,remainA,gridSz);
        sign[curlv]=0;
    }
    if(remainA){//���Է��ù�����
        sign[curlv]=2;
        if(cutF(curlv+1,remainF,gridSz)){
            if(gridVec[curlv].isFighterOnly){
                sign[curlv]=0;
                baoliSearch(curlv+1,remainF,remainA,gridSz);
            }
            else{
                baoliSearch(curlv+1,remainF,remainA-1,gridSz);
            }
        }
        sign[curlv]=0;
    }
}